

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::InnerMap::Resize(InnerMap *this,size_t new_num_buckets)

{
  Arena *this_00;
  void **ppvVar1;
  LogMessage *other;
  void **ppvVar2;
  size_type index;
  size_type sVar4;
  LogFinisher local_61;
  LogMessage local_60;
  ulong uVar3;
  
  sVar4 = this->num_buckets_;
  if (sVar4 == 1) {
    this->index_of_first_non_null_ = 8;
    this->num_buckets_ = 8;
    this_00 = (this->alloc_).arena_;
    if (this_00 == (Arena *)0x0) {
      ppvVar1 = (void **)operator_new(0x40);
    }
    else {
      ppvVar1 = (void **)Arena::AllocateAlignedWithHook
                                   (this_00,0x40,(type_info *)&unsigned_char::typeinfo);
    }
    ppvVar1[6] = (void *)0x0;
    ppvVar1[7] = (void *)0x0;
    ppvVar1[4] = (void *)0x0;
    ppvVar1[5] = (void *)0x0;
    ppvVar1[2] = (void *)0x0;
    ppvVar1[3] = (void *)0x0;
    *ppvVar1 = (void *)0x0;
    ppvVar1[1] = (void *)0x0;
    this->table_ = ppvVar1;
    uVar3 = rdtsc();
    this->seed_ = (uVar3 & 0xffffffff) + ((ulong)this >> 4) + (uVar3 & 0xffffffff00000000);
  }
  else {
    if (new_num_buckets < 8) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                 ,0x3a0);
      other = internal::LogMessage::operator<<
                        (&local_60,"CHECK failed: (new_num_buckets) >= (kMinTableSize): ");
      internal::LogFinisher::operator=(&local_61,other);
      internal::LogMessage::~LogMessage(&local_60);
      sVar4 = this->num_buckets_;
    }
    ppvVar1 = this->table_;
    this->num_buckets_ = new_num_buckets;
    ppvVar2 = CreateEmptyTable(this,new_num_buckets);
    this->table_ = ppvVar2;
    index = this->index_of_first_non_null_;
    this->index_of_first_non_null_ = this->num_buckets_;
    while (index < sVar4) {
      uVar3 = index;
      if (ppvVar1[index] != (void *)0x0) {
        if (ppvVar1[index] == ppvVar1[index ^ 1]) {
          uVar3 = index + 1;
          TransferTree(this,ppvVar1,index);
        }
        else {
          TransferList(this,ppvVar1,index);
        }
      }
      index = uVar3 + 1;
    }
    if ((this->alloc_).arena_ == (Arena *)0x0) {
      operator_delete(ppvVar1,sVar4 << 3);
    }
  }
  return;
}

Assistant:

void Resize(size_t new_num_buckets) {
      if (num_buckets_ == internal::kGlobalEmptyTableSize) {
        // This is the global empty array.
        // Just overwrite with a new one. No need to transfer or free anything.
        num_buckets_ = index_of_first_non_null_ = kMinTableSize;
        table_ = CreateEmptyTable(num_buckets_);
        seed_ = Seed();
        return;
      }

      GOOGLE_DCHECK_GE(new_num_buckets, kMinTableSize);
      void** const old_table = table_;
      const size_type old_table_size = num_buckets_;
      num_buckets_ = new_num_buckets;
      table_ = CreateEmptyTable(num_buckets_);
      const size_type start = index_of_first_non_null_;
      index_of_first_non_null_ = num_buckets_;
      for (size_type i = start; i < old_table_size; i++) {
        if (internal::TableEntryIsNonEmptyList(old_table, i)) {
          TransferList(old_table, i);
        } else if (internal::TableEntryIsTree(old_table, i)) {
          TransferTree(old_table, i++);
        }
      }
      Dealloc<void*>(old_table, old_table_size);
    }